

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O2

char * host_ca_save(host_ca *hca)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  FILE *__s;
  char *pcVar4;
  ptrlen pVar5;
  
  if (*hca->name == '\0') {
    pcVar3 = dupstr("CA record must have a name");
    return pcVar3;
  }
  pcVar3 = make_filename(7,hca->name);
  __s = fopen(pcVar3,"w");
  if (__s != (FILE *)0x0) {
    fwrite("PublicKey=",10,1,__s);
    pVar5.ptr = hca->ca_public_key->u;
    pVar5.len = hca->ca_public_key->len;
    pcVar4 = (char *)0x0;
    base64_encode_fp((FILE *)__s,pVar5,0);
    fputc(10,__s);
    fwrite("Validity=",9,1,__s);
    pVar5 = ptrlen_from_asciz(hca->validity_expression);
    percent_encode_fp((FILE *)__s,pVar5,(char *)0x0);
    fputc(10,__s);
    fprintf(__s,"PermitRSASHA1=%d\n",(ulong)(hca->opts).permit_rsa_sha1);
    fprintf(__s,"PermitRSASHA256=%d\n",(ulong)(hca->opts).permit_rsa_sha256);
    fprintf(__s,"PermitRSASHA512=%d\n",(ulong)(hca->opts).permit_rsa_sha512);
    iVar1 = ferror(__s);
    iVar2 = fclose(__s);
    if ((iVar1 != 0) || (iVar2 < 0)) {
      pcVar4 = dupprintf("Unable to write file \'%s\'",pcVar3);
    }
    safefree(pcVar3);
    return pcVar4;
  }
  pcVar3 = dupprintf("Unable to open file \'%s\'",pcVar3);
  return pcVar3;
}

Assistant:

char *host_ca_save(host_ca *hca)
{
    if (!*hca->name)
        return dupstr("CA record must have a name");

    char *filename = make_filename(INDEX_HOSTCA, hca->name);
    FILE *fp = fopen(filename, "w");
    if (!fp)
        return dupprintf("Unable to open file '%s'", filename);

    fprintf(fp, "PublicKey=");
    base64_encode_fp(fp, ptrlen_from_strbuf(hca->ca_public_key), 0);
    fprintf(fp, "\n");

    fprintf(fp, "Validity=");
    percent_encode_fp(fp, ptrlen_from_asciz(hca->validity_expression), NULL);
    fprintf(fp, "\n");

    fprintf(fp, "PermitRSASHA1=%d\n", (int)hca->opts.permit_rsa_sha1);
    fprintf(fp, "PermitRSASHA256=%d\n", (int)hca->opts.permit_rsa_sha256);
    fprintf(fp, "PermitRSASHA512=%d\n", (int)hca->opts.permit_rsa_sha512);

    bool bad = ferror(fp);
    if (fclose(fp) < 0)
        bad = true;

    char *err = NULL;
    if (bad)
        err = dupprintf("Unable to write file '%s'", filename);

    sfree(filename);
    return err;
}